

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTimestepper.cpp
# Opt level: O2

void __thiscall
chrono::ChTimestepperEulerImplicitLinearized::Advance
          (ChTimestepperEulerImplicitLinearized *this,double dt)

{
  ChStateDelta *this_00;
  ChState *pCVar1;
  ChVectorDynamic<> *this_01;
  ChVectorDynamic<> *this_02;
  ChIntegrable *pCVar2;
  ChVectorDynamic<> *pCVar3;
  int iVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dt_local;
  ChVectorDynamic<> *local_a8;
  double *local_a0;
  ChState *local_98;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *local_90;
  ChStateDelta local_88;
  ChStateDelta local_70;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_58;
  
  this_00 = &(this->super_ChTimestepperIIorder).V;
  pCVar1 = &(this->super_ChTimestepperIIorder).X;
  pCVar2 = (this->super_ChTimestepperIIorder).super_ChTimestepper.integrable;
  dt_local = dt;
  local_98 = pCVar1;
  (*pCVar2->_vptr_ChIntegrable[0x15])(pCVar2,pCVar1,this_00,&(this->super_ChTimestepperIIorder).A);
  iVar4 = (*pCVar2->_vptr_ChIntegrable[2])(pCVar2);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            (&(this->Dl).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(long)iVar4)
  ;
  local_a8 = &this->R;
  iVar4 = (*pCVar2->_vptr_ChIntegrable[0x13])(pCVar2);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            (&(this->R).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(long)iVar4);
  this_02 = &this->Qc;
  iVar4 = (*pCVar2->_vptr_ChIntegrable[2])(pCVar2);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            (&this_02->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(long)iVar4);
  this_01 = &(this->super_ChTimestepperIIorder).super_ChTimestepper.L;
  iVar4 = (*pCVar2->_vptr_ChIntegrable[2])(pCVar2);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            (&this_01->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(long)iVar4);
  local_a0 = &(this->super_ChTimestepperIIorder).super_ChTimestepper.T;
  (*pCVar2->_vptr_ChIntegrable[0x16])(pCVar2,pCVar1,this_00);
  (*pCVar2->_vptr_ChIntegrable[8])(pCVar2,this_01);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this_01,&dt_local);
  local_90 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->Vold;
  ChStateDelta::operator=((ChStateDelta *)local_90,this_00);
  pCVar3 = local_a8;
  (*pCVar2->_vptr_ChIntegrable[0xe])(dt_local,pCVar2,local_a8);
  (*pCVar2->_vptr_ChIntegrable[0x1d])(0x3ff0000000000000,pCVar2,pCVar3,this_00);
  (*pCVar2->_vptr_ChIntegrable[0x10])
            (1.0 / dt_local,(this->super_ChTimestepperIIorder).super_ChTimestepper.Qc_clamping,
             pCVar2,this_02,
             (ulong)(this->super_ChTimestepperIIorder).super_ChTimestepper.Qc_do_clamp);
  (*pCVar2->_vptr_ChIntegrable[0x11])(0x3ff0000000000000,pCVar2,this_02);
  pCVar1 = local_98;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = dt_local;
  auVar5._8_8_ = 0x8000000000000000;
  auVar5._0_8_ = 0x8000000000000000;
  auVar5 = vxorpd_avx512vl(auVar6,auVar5);
  (*pCVar2->_vptr_ChIntegrable[0x1c])
            (0x3ff0000000000000,auVar5._0_8_,dt_local * auVar5._0_8_,
             dt_local + (this->super_ChTimestepperIIorder).super_ChTimestepper.T,pCVar2,this_00,
             this_01,local_a8,this_02,local_98,this_00,0,0,1);
  local_58.
  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
  .
  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
  .m_data = (PointerType)(1.0 / dt_local);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this_01,(Scalar *)&local_58);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_58,
             local_90,(type *)0x0);
  ChStateDelta::operator-(&local_88,this_00,&local_58);
  ChStateDelta::operator*(&local_70,&local_88,1.0 / dt_local);
  (*pCVar2->_vptr_ChIntegrable[0x19])(pCVar2,&local_70);
  Eigen::internal::handmade_aligned_free
            (local_70.super_ChVectorDynamic<double>.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  Eigen::internal::handmade_aligned_free
            (local_88.super_ChVectorDynamic<double>.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  Eigen::internal::handmade_aligned_free
            (local_58.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data);
  ChStateDelta::operator*((ChStateDelta *)&local_58,this_00,dt_local);
  chrono::operator+=(pCVar1,(ChStateDelta *)&local_58);
  Eigen::internal::handmade_aligned_free
            (local_58.
             super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
             .
             super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
             .m_data);
  *local_a0 = dt_local + *local_a0;
  (*pCVar2->_vptr_ChIntegrable[0x17])(pCVar2,pCVar1,this_00,1);
  (*pCVar2->_vptr_ChIntegrable[9])(pCVar2,this_01);
  return;
}

Assistant:

void ChTimestepperEulerImplicitLinearized::Advance(const double dt) {
    // downcast
    ChIntegrableIIorder* mintegrable = (ChIntegrableIIorder*)this->integrable;

    // setup main vectors
    mintegrable->StateSetup(X, V, A);

    // setup auxiliary vectors
    Dl.setZero(mintegrable->GetNconstr());
    R.setZero(mintegrable->GetNcoords_v());
    Qc.setZero(mintegrable->GetNconstr());
    L.setZero(mintegrable->GetNconstr());

    mintegrable->StateGather(X, V, T);  // state <- system

    mintegrable->StateGatherReactions(L);  // state <- system (may be needed for warm starting StateSolveCorrection)
    L *= dt;                               // because reactions = forces, here L = impulses

    Vold = V;

    // solve only 1st NR step, using v_new = 0, so  Dv = v_new , therefore
    //
    // [ M - dt*dF/dv - dt^2*dF/dx    Cq' ] [ Dv     ] = [ M*(v_old - v_new) + dt*f]
    // [ Cq                           0   ] [ -dt*Dl ] = [ -C/dt - Ct ]
    //
    // becomes the Anitescu/Trinkle timestepper:
    //
    // [ M - dt*dF/dv - dt^2*dF/dx    Cq' ] [ v_new  ] = [ M*(v_old) + dt*f]
    // [ Cq                           0   ] [ -dt*l  ] = [ -C/dt - Ct ]

    mintegrable->LoadResidual_F(R, dt);
    mintegrable->LoadResidual_Mv(R, V, 1.0);
    mintegrable->LoadConstraint_C(Qc, 1.0 / dt, Qc_do_clamp, Qc_clamping);
    mintegrable->LoadConstraint_Ct(Qc, 1.0);

    mintegrable->StateSolveCorrection(  //
        V, L, R, Qc,                    //
        1.0,                            // factor for  M
        -dt,                            // factor for  dF/dv
        -dt * dt,                       // factor for  dF/dx
        X, V, T + dt,                   // not needed
        false,                          // do not scatter update to Xnew Vnew T+dt before computing correction
        false,                          // full update? (not used, since no scatter)
        true                            // force a call to the solver's Setup() function
    );

    L *= (1.0 / dt);  // Note it is not -(1.0/dt) because we assume StateSolveCorrection already flips sign of Dl

    mintegrable->StateScatterAcceleration(
        (V - Vold) * (1 / dt));  // -> system auxiliary data (i.e acceleration as measure, fits DVI/MDI)

    X += V * dt;

    T += dt;

    mintegrable->StateScatter(X, V, T, true);  // state -> system
    mintegrable->StateScatterReactions(L);     // -> system auxiliary data
}